

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

bool CSOAA::test_ldf_sequence(ldf *data,multi_ex *ec_seq)

{
  vw_ostream *pvVar1;
  pointer ppeVar2;
  vw *pvVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  example **ec;
  pointer ppeVar7;
  
  ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppeVar7) {
    bVar5 = 1;
  }
  else {
    bVar5 = (*(code *)PTR_test_label_002d9a70)(&(*ppeVar7)->l);
  }
  ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar7 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppeVar7 != ppeVar2; ppeVar7 = ppeVar7 + 1) {
    bVar6 = (*(code *)PTR_test_label_002d9a70)(&(*ppeVar7)->l);
    if (bVar6 != (bVar5 & 1)) {
      pvVar3 = data->all;
      pvVar1 = &pvVar3->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,
                 "warning: ldf example has mix of train/test data; assuming test",0x3e);
      cVar4 = (char)pvVar1;
      std::ios::widen((char)(pvVar3->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      bVar5 = 1;
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool test_ldf_sequence(ldf& data, multi_ex& ec_seq)
{
  bool isTest;
  if (0 == ec_seq.size())
    isTest = true;
  else
    isTest = COST_SENSITIVE::cs_label.test_label(&ec_seq[0]->l);
  for (const auto & ec : ec_seq)
  {
    // Each sub-example must have just one cost
    assert(ec->l.cs.costs.size() == 1);

    if (COST_SENSITIVE::cs_label.test_label(&ec->l) != isTest)
    {
      isTest = true;
      data.all->trace_message << "warning: ldf example has mix of train/test data; assuming test" << endl;
    }
  }
  return isTest;
}